

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expected.t.cpp
# Opt level: O1

ostream * operator<<(ostream *os,OracleVal *o)

{
  ostream *poVar1;
  int local_34;
  string local_30;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[oracle:",8);
  local_34 = *(int *)(o + 4);
  lest::make_value_string<int>(&local_30,&local_34);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_30._M_dataplus._M_p,local_30._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return poVar1;
}

Assistant:

std::ostream & operator<<( std::ostream & os, OracleVal const & o )
{
    using lest::to_string;
    return os << "[oracle:" << to_string( o.i ) << "]";
}